

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s.c
# Opt level: O3

int blake2s_compress(hash_state *md,uchar *buf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  
  iVar1 = *(int *)buf;
  iVar2 = *(int *)(buf + 4);
  iVar3 = *(int *)(buf + 8);
  iVar4 = *(int *)(buf + 0xc);
  uVar24 = (md->blake2s).h[0] + (md->sha256).state[2] + iVar1;
  uVar21 = (md->sha256).state[6] ^ uVar24 ^ 0x510e527f;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x10;
  uVar28 = uVar21 + 0x6a09e667 ^ (md->sha256).state[2];
  uVar28 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar25 = uVar24 + iVar2 + uVar28;
  uVar24 = uVar25 ^ uVar21;
  uVar34 = uVar24 >> 8 | uVar24 << 0x18;
  uVar21 = uVar34 + 0x6a09e667 + uVar21;
  uVar28 = uVar28 ^ uVar21;
  uVar29 = uVar28 >> 7 | uVar28 << 0x19;
  uVar28 = (md->blake2s).h[1] + (md->sha256).state[3] + iVar3;
  uVar24 = (md->sha256).state[7] ^ uVar28 ^ 0x9b05688c;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar30 = uVar24 + 0xbb67ae85 ^ (md->sha256).state[3];
  uVar30 = uVar30 >> 0xc | uVar30 << 0x14;
  uVar27 = uVar28 + iVar4 + uVar30;
  uVar28 = uVar27 ^ uVar24;
  uVar32 = uVar28 >> 8 | uVar28 << 0x18;
  uVar24 = uVar32 + 0xbb67ae85 + uVar24;
  uVar30 = uVar30 ^ uVar24;
  iVar5 = *(int *)(buf + 0x10);
  uVar31 = uVar30 >> 7 | uVar30 << 0x19;
  uVar30 = (md->sha256).state[0] + (md->sha256).state[4] + iVar5;
  iVar6 = *(int *)(buf + 0x14);
  uVar28 = (md->sha256).curlen ^ uVar30 ^ 0x1f83d9ab;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x10;
  uVar35 = uVar28 + 0x3c6ef372 ^ (md->sha256).state[4];
  uVar35 = uVar35 >> 0xc | uVar35 << 0x14;
  uVar22 = uVar30 + iVar6 + uVar35;
  uVar30 = uVar22 ^ uVar28;
  uVar33 = uVar30 >> 8 | uVar30 << 0x18;
  uVar28 = uVar33 + 0x3c6ef372 + uVar28;
  uVar35 = uVar35 ^ uVar28;
  iVar7 = *(int *)(buf + 0x18);
  uVar36 = uVar35 >> 7 | uVar35 << 0x19;
  uVar35 = (md->sha256).state[1] + (md->sha256).state[5] + iVar7;
  iVar8 = *(int *)(buf + 0x1c);
  uVar30 = (md->blake2s).f[1] ^ uVar35 ^ 0x5be0cd19;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x10;
  iVar9 = *(int *)(buf + 0x24);
  uVar23 = uVar30 + 0xa54ff53a ^ (md->sha256).state[5];
  iVar10 = *(int *)(buf + 0x20);
  iVar11 = *(int *)(buf + 0x28);
  uVar26 = uVar25 + iVar10 + uVar31;
  iVar12 = *(int *)(buf + 0x2c);
  iVar13 = *(int *)(buf + 0x30);
  uVar27 = uVar27 + iVar11 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  iVar14 = *(int *)(buf + 0x34);
  iVar15 = *(int *)(buf + 0x38);
  iVar16 = *(int *)(buf + 0x3c);
  uVar25 = uVar23 >> 0xc | uVar23 << 0x14;
  uVar35 = uVar35 + iVar8 + uVar25;
  uVar23 = uVar35 ^ uVar30;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar23 + 0xa54ff53a + uVar30;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar22 = uVar22 + iVar13 + uVar25;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar9 + uVar31;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar12 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar35 = uVar35 + iVar15 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar27 = uVar27 + iVar5 + uVar31;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar14 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar32 = uVar32 ^ uVar27;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar22 = uVar22 + iVar9 + uVar36;
  uVar24 = uVar24 + uVar33;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar35 = uVar35 + iVar16 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar33 = uVar33 ^ uVar22;
  uVar35 = uVar35 + iVar14 + uVar25;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar15 + uVar29;
  uVar23 = uVar23 ^ uVar35;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar26 = uVar26 + iVar11 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar10 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar26 = uVar26 + iVar2 + uVar31;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar16 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar30 = uVar30 + uVar23;
  uVar27 = uVar27 + iVar1 + uVar36;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar7 + uVar25;
  uVar34 = uVar34 ^ uVar27;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar22 = uVar22 + iVar12 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar13 + uVar31;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar3 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar8 + uVar25;
  uVar35 = uVar35 + iVar6 + uVar29;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar33 = uVar33 ^ uVar35;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar27 = uVar27 + iVar13 + uVar31;
  uVar24 = uVar24 + uVar33;
  uVar32 = uVar32 ^ uVar27;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar22 = uVar22 + iVar6 + uVar36;
  uVar35 = uVar35 + iVar4 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar33 = uVar33 ^ uVar22;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar12 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar35 = uVar35 + iVar16 + uVar25;
  uVar23 = uVar23 ^ uVar35;
  uVar26 = uVar26 + iVar10 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar1 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar26 = uVar26 + iVar11 + uVar31;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar3 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar30 = uVar30 + uVar23;
  uVar27 = uVar27 + iVar4 + uVar36;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar14 + uVar25;
  uVar34 = uVar34 ^ uVar27;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar22 = uVar22 + iVar8 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar15 + uVar31;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar7 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar2 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar27 = uVar27 + iVar4 + uVar31;
  uVar35 = uVar35 + iVar9 + uVar29;
  uVar32 = uVar32 ^ uVar27;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar22 = uVar22 + iVar14 + uVar36;
  uVar24 = uVar24 + uVar33;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar35 = uVar35 + iVar5 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar33 = uVar33 ^ uVar22;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar8 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar35 = uVar35 + iVar12 + uVar25;
  uVar21 = uVar21 + uVar34;
  uVar23 = uVar23 ^ uVar35;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar26 = uVar26 + iVar9 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar2 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar28 = uVar28 + uVar33;
  uVar26 = uVar26 + iVar3 + uVar31;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar13 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar30 = uVar30 + uVar23;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar15 + uVar25;
  uVar27 = uVar27 + iVar6 + uVar36;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar34 = uVar34 ^ uVar27;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar22 = uVar22 + iVar5 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar7 + uVar31;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar11 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar35 = uVar35 + iVar16 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar27 = uVar27 + iVar6 + uVar31;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar1 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar32 = uVar32 ^ uVar27;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar24 = uVar24 + uVar33;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar35 = uVar35 + iVar10 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar9 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar21 = uVar21 + uVar34;
  uVar22 = uVar22 + iVar3 + uVar36;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar33 = uVar33 ^ uVar22;
  uVar35 = uVar35 + iVar11 + uVar25;
  uVar23 = uVar23 ^ uVar35;
  uVar26 = uVar26 + iVar1 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar8 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar26 = uVar26 + iVar15 + uVar31;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar5 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar30 = uVar30 + uVar23;
  uVar27 = uVar27 + iVar12 + uVar36;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar16 + uVar25;
  uVar34 = uVar34 ^ uVar27;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar22 = uVar22 + iVar7 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar2 + uVar31;
  uVar35 = uVar35 + iVar4 + uVar29;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar33 = uVar33 ^ uVar35;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar13 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar10 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar27 = uVar27 + iVar7 + uVar31;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar24 = uVar24 + uVar33;
  uVar32 = uVar32 ^ uVar27;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar35 = uVar35 + iVar14 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar3 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar21 = uVar21 + uVar34;
  uVar22 = uVar22 + iVar1 + uVar36;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar33 = uVar33 ^ uVar22;
  uVar35 = uVar35 + iVar10 + uVar25;
  uVar23 = uVar23 ^ uVar35;
  uVar26 = uVar26 + iVar13 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar11 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar26 = uVar26 + iVar5 + uVar31;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar12 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar30 = uVar30 + uVar23;
  uVar27 = uVar27 + iVar8 + uVar36;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar4 + uVar25;
  uVar34 = uVar34 ^ uVar27;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar22 = uVar22 + iVar16 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar14 + uVar31;
  uVar35 = uVar35 + iVar2 + uVar29;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar33 = uVar33 ^ uVar35;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar6 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar15 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar27 = uVar27 + iVar2 + uVar31;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar24 = uVar24 + uVar33;
  uVar32 = uVar32 ^ uVar27;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar35 = uVar35 + iVar9 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar13 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar21 = uVar21 + uVar34;
  uVar22 = uVar22 + iVar15 + uVar36;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar33 = uVar33 ^ uVar22;
  uVar35 = uVar35 + iVar5 + uVar25;
  uVar23 = uVar23 ^ uVar35;
  uVar26 = uVar26 + iVar6 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar16 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar26 = uVar26 + iVar1 + uVar31;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar14 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar30 = uVar30 + uVar23;
  uVar27 = uVar27 + iVar7 + uVar36;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar11 + uVar25;
  uVar34 = uVar34 ^ uVar27;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar22 = uVar22 + iVar9 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar8 + uVar31;
  uVar35 = uVar35 + iVar10 + uVar29;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar33 = uVar33 ^ uVar35;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar4 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar3 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar27 = uVar27 + iVar8 + uVar31;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar24 = uVar24 + uVar33;
  uVar32 = uVar32 ^ uVar27;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar22 = uVar22 + iVar13 + uVar36;
  uVar35 = uVar35 + iVar12 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar33 = uVar33 ^ uVar22;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar14 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar21 = uVar21 + uVar34;
  uVar35 = uVar35 + iVar4 + uVar25;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar26 = uVar26 + iVar12 + uVar29;
  uVar23 = uVar23 ^ uVar35;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar15 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar26 = uVar26 + iVar6 + uVar31;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar2 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar27 = uVar27 + iVar16 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar30 = uVar30 + uVar23;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar9 + uVar25;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar22 = uVar22 + iVar10 + uVar25;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar1 + uVar31;
  uVar35 = uVar35 + iVar3 + uVar29;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar33 = uVar33 ^ uVar35;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar5 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar27 = uVar27 + iVar15 + uVar31;
  uVar22 = uVar22 + iVar7 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar32 = uVar32 ^ uVar27;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar22 = uVar22 + iVar12 + uVar36;
  uVar24 = uVar24 + uVar33;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar35 = uVar35 + iVar11 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar33 = uVar33 ^ uVar22;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar7 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar35 = uVar35 + iVar1 + uVar25;
  uVar21 = uVar21 + uVar34;
  uVar23 = uVar23 ^ uVar35;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar26 = uVar26 + iVar16 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar9 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar28 = uVar28 + uVar33;
  uVar26 = uVar26 + iVar13 + uVar31;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar4 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar30 = uVar30 + uVar23;
  uVar27 = uVar27 + iVar14 + uVar36;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar10 + uVar25;
  uVar34 = uVar34 ^ uVar27;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar22 = uVar22 + iVar2 + uVar25;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar3 + uVar31;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar35 = uVar35 + iVar11 + uVar29;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar8 + uVar36;
  uVar33 = uVar33 ^ uVar35;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar5 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar21 = uVar21 + uVar32;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar27 = uVar27 + iVar10 + uVar31;
  uVar24 = uVar24 + uVar33;
  uVar32 = uVar32 ^ uVar27;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar22 = uVar22 + iVar8 + uVar36;
  uVar35 = uVar35 + iVar6 + uVar29;
  uVar33 = uVar33 ^ uVar35;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar24 = uVar24 + uVar33;
  uVar33 = uVar33 ^ uVar22;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar26 = uVar26 + iVar11 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar35 = uVar35 + iVar2 + uVar25;
  uVar23 = uVar23 ^ uVar35;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar26 = uVar26 + iVar3 + uVar29;
  uVar34 = uVar34 ^ uVar26;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar21 = uVar21 + uVar34;
  uVar29 = uVar29 ^ uVar21;
  uVar29 = uVar29 >> 7 | uVar29 << 0x19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar27 = uVar27 + iVar5 + uVar31;
  uVar32 = uVar32 ^ uVar27;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar24 = uVar24 + uVar32;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar28 = uVar28 + uVar33;
  uVar26 = uVar26 + iVar16 + uVar31;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar22 = uVar22 + iVar7 + uVar36;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 >> 7 | uVar36 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar27 = uVar27 + iVar9 + uVar36;
  uVar30 = uVar30 + uVar23;
  uVar34 = uVar34 ^ uVar27;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar35 = uVar35 + iVar6 + uVar25;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar30 = uVar30 + uVar23;
  uVar23 = uVar23 ^ uVar26;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar22 = uVar22 + iVar4 + uVar25;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar26 + iVar12 + uVar31;
  uVar35 = uVar35 + iVar14 + uVar29;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar33 = uVar33 ^ uVar35;
  uVar31 = uVar31 ^ uVar28;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar36 = uVar36 ^ uVar30;
  uVar36 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar27 = uVar27 + iVar15 + uVar36;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  auVar17 = vpinsrd_avx(ZEXT416(uVar26),uVar27,1);
  uVar36 = uVar36 ^ uVar30;
  uVar26 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar21 = uVar21 + uVar26;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar22 = uVar22 + iVar13 + uVar25;
  uVar26 = uVar26 ^ uVar22;
  uVar26 = uVar26 >> 8 | uVar26 << 0x18;
  uVar21 = uVar21 + uVar26;
  auVar18 = vpinsrd_avx(ZEXT416(uVar34),uVar26,1);
  auVar17 = vpinsrd_avx(auVar17,uVar22,2);
  uVar25 = uVar25 ^ uVar21;
  uVar22 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar24 = uVar24 + uVar22;
  uVar29 = uVar29 ^ uVar24;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar35 = uVar35 + iVar1 + uVar29;
  uVar22 = uVar22 ^ uVar35;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar24 = uVar24 + uVar22;
  auVar18 = vpinsrd_avx(auVar18,uVar22,2);
  auVar17 = vpinsrd_avx(auVar17,uVar35,3);
  auVar19 = vpinsrd_avx(ZEXT416(uVar21),uVar24,1);
  auVar19 = vpinsrd_avx(auVar19,uVar28,2);
  uVar24 = uVar24 ^ uVar29;
  auVar18 = vpinsrd_avx(auVar18,uVar23,3);
  auVar20 = vpinsrd_avx(ZEXT416(uVar24 >> 7 | uVar24 << 0x19),uVar31 >> 7 | uVar31 << 0x19,1);
  auVar20 = vpinsrd_avx(auVar20,uVar36 >> 7 | uVar36 << 0x19,2);
  auVar20 = vpinsrd_avx(auVar20,uVar25 >> 7 | uVar25 << 0x19,3);
  auVar19 = vpinsrd_avx(auVar19,uVar30,3);
  auVar37._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
  auVar37._16_16_ = ZEXT116(1) * auVar18;
  auVar38._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar17;
  auVar38._16_16_ = ZEXT116(1) * auVar20;
  auVar37 = vpternlogd_avx512vl(auVar38,auVar37,*(undefined1 (*) [32])(md->blake2s).h,0x96);
  *(undefined1 (*) [32])(md->blake2s).h = auVar37;
  return (int)md;
}

Assistant:

static int blake2s_compress(hash_state *md, const unsigned char *buf)
#endif
{
   unsigned long i;
   ulong32 m[16];
   ulong32 v[16];

   for (i = 0; i < 16; ++i) {
      LOAD32L(m[i], buf + i * sizeof(m[i]));
   }

   for (i = 0; i < 8; ++i)
      v[i] = md->blake2s.h[i];

   v[8] = blake2s_IV[0];
   v[9] = blake2s_IV[1];
   v[10] = blake2s_IV[2];
   v[11] = blake2s_IV[3];
   v[12] = md->blake2s.t[0] ^ blake2s_IV[4];
   v[13] = md->blake2s.t[1] ^ blake2s_IV[5];
   v[14] = md->blake2s.f[0] ^ blake2s_IV[6];
   v[15] = md->blake2s.f[1] ^ blake2s_IV[7];

   ROUND(0);
   ROUND(1);
   ROUND(2);
   ROUND(3);
   ROUND(4);
   ROUND(5);
   ROUND(6);
   ROUND(7);
   ROUND(8);
   ROUND(9);

   for (i = 0; i < 8; ++i)
      md->blake2s.h[i] = md->blake2s.h[i] ^ v[i] ^ v[i + 8];

   return CRYPT_OK;
}